

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

int __thiscall
TPZFMatrix<long_double>::Substitution
          (TPZFMatrix<long_double> *this,TPZFMatrix<long_double> *B,TPZVec<int> *index)

{
  longdouble lVar1;
  char cVar2;
  long size;
  ostream *poVar3;
  longdouble *plVar4;
  long col;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar15;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble local_b4;
  TPZVec<long_double> v;
  
  if (B == (TPZFMatrix<long_double> *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "virtual int TPZFMatrix<long double>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long double]"
                            );
    pcVar9 = "TPZFMatrix<>*B eh nulo";
LAB_00cb32e6:
    poVar3 = std::operator<<(poVar3,pcVar9);
  }
  else {
    cVar2 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed;
    if (cVar2 != '\x02') {
      if (cVar2 == '\0') {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "virtual int TPZFMatrix<long double>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long double]"
                                );
        pcVar9 = anon_var_dwarf_2dfcec;
        goto LAB_00cb32e6;
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "virtual int TPZFMatrix<long double>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long double]"
                              );
      poVar3 = std::operator<<(poVar3,"\nfDecomposed != ELUPivot");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    lVar6 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
    size = index->fNElements;
    if ((size == (int)lVar6) && ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow == size)
       ) {
      lVar5 = (lVar6 << 0x20) + -0x100000000 >> 0x20;
      col = 0;
      lVar6 = 0;
      if (0 < size) {
        lVar6 = size;
      }
      lVar7 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
      if (lVar7 < 1) {
        lVar7 = col;
      }
      for (; col != lVar7; col = col + 1) {
        TPZVec<long_double>::TPZVec(&v,size);
        lVar8 = 0;
        lVar10 = lVar6;
        while (bVar14 = lVar10 != 0, lVar10 = lVar10 + -1, bVar14) {
          plVar4 = operator()(B,(long)*(int *)((long)index->fStore + lVar8),col);
          *(longdouble *)((long)v.fStore + lVar8 * 4) = *plVar4;
          lVar8 = lVar8 + 4;
        }
        for (lVar10 = 0; lVar8 = lVar5, lVar11 = lVar5 * 0x10 + 0x10, lVar12 = lVar5 + 1,
            lVar10 != lVar6; lVar10 = lVar10 + 1) {
          lVar8 = 0;
          lVar15 = (longdouble)0;
          for (lVar11 = 0; lVar10 != lVar11; lVar11 = lVar11 + 1) {
            (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x21])(this,lVar10,lVar11);
            lVar15 = lVar15 + *(longdouble *)((long)v.fStore + lVar8) * in_ST0;
            lVar8 = lVar8 + 0x10;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = in_ST6;
          }
          v.fStore[lVar10] = v.fStore[lVar10] - lVar15;
          in_ST6 = in_ST5;
        }
        for (; -1 < lVar8; lVar8 = lVar8 + -1) {
          local_b4 = (longdouble)0;
          lVar10 = lVar11;
          lVar15 = in_ST0;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          for (lVar13 = lVar12; lVar13 < size; lVar13 = lVar13 + 1) {
            (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x21])(this,lVar8,lVar13);
            local_b4 = local_b4 + *(longdouble *)((long)v.fStore + lVar10) * lVar15;
            lVar10 = lVar10 + 0x10;
            lVar15 = in_ST0;
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST6;
          }
          lVar1 = v.fStore[lVar8];
          (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x21])(this,lVar8,lVar8);
          v.fStore[lVar8] = (lVar1 - local_b4) / lVar15;
          lVar11 = lVar11 + -0x10;
          lVar12 = lVar12 + -1;
          in_ST5 = in_ST4;
          in_ST6 = in_ST4;
        }
        lVar10 = 0;
        for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
          lVar15 = *(longdouble *)((long)v.fStore + lVar10);
          plVar4 = operator()(B,lVar8,col);
          *plVar4 = lVar15;
          lVar10 = lVar10 + 0x10;
        }
        TPZVec<long_double>::~TPZVec(&v);
      }
      return 1;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2dfd0e);
    poVar3 = std::operator<<(poVar3,"this->fIndex = ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,"  b = ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  }
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B, const TPZVec<int> &index ) const{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    if (!this->fDecomposed){
        PZError <<  __PRETTY_FUNCTION__ << "Matriz não decomposta" << endl;
        return 0;
    }
    
    if (this->fDecomposed != ELUPivot){
        PZError << __PRETTY_FUNCTION__ << "\nfDecomposed != ELUPivot" << endl;
    }
    
    int nRows = this->Rows();
    
    if (index.NElements() != nRows || b.Rows() != nRows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t ncols = B->Cols();
    for(int64_t ic = 0; ic<ncols; ic++)
    {
        int64_t i,j;
        TVar sum = 0;
        
        TPZVec<TVar> v(nRows);
        
        
        for (i=0;i<nRows;i++)
        {
            v[i] = b(index[i],ic);
        }
        
        //Ly=b
        for (i=0;i<nRows;i++)
        {
            sum = 0.;
            for (j=0;j<(i);j++) sum +=this->Get(i,j) * v[j];
            v[i] -= sum;
        }
        
        //Ux=y
        for (i=(nRows-1);i>-1;i--)
        {
            sum = 0.;
            for (j=(i+1);j<nRows;j++) sum += this->Get(i,j) * v[j];
            v[i] = (v[i] - sum) / this->Get(i,i);
        }
        
        for (i=0;i<nRows;i++) b(i,ic) = v[i];
    }
    return 1;
}